

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O0

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::QuadratizeOrLinearize
          (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,EExpr *el,EExpr *er)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  pointer in_RCX;
  pointer in_RDX;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  double dVar5;
  LinTerms *erlt;
  LinTerms *ellt;
  LinTerms *in_stack_fffffffffffff9f8;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa0c;
  EExpr *in_stack_fffffffffffffa10;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffa18;
  AlgebraicExpression<mp::QuadAndLinTerms> *in_stack_fffffffffffffa20;
  LinTerms *in_stack_fffffffffffffa30;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *this_00;
  undefined1 local_5a0 [32];
  EExpr *in_stack_fffffffffffffa80;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffa88;
  LinTerms *in_stack_fffffffffffffa98;
  LinTerms *in_stack_fffffffffffffaa0;
  EnvKeeper in_stack_fffffffffffffaa8;
  EExpr *in_stack_fffffffffffffca8;
  EExpr *in_stack_fffffffffffffcb0;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffcb8;
  LinTerms *in_stack_fffffffffffffd88;
  EExpr *in_stack_fffffffffffffd90;
  LinTerms local_258 [4];
  pointer local_20;
  pointer local_18;
  
  this_00 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  bVar1 = AlgebraicExpression<mp::QuadAndLinTerms>::is_affine
                    ((AlgebraicExpression<mp::QuadAndLinTerms> *)0x3e526e);
  if ((!bVar1) &&
     (bVar1 = AlgebraicExpression<mp::QuadAndLinTerms>::is_constant
                        ((AlgebraicExpression<mp::QuadAndLinTerms> *)0x3e5283), !bVar1)) {
    Convert2AffineExpr(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
    in_stack_fffffffffffffa30 = local_258;
    LinTerms::LinTerms((LinTerms *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    EExpr::EExpr(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    EExpr::operator=((EExpr *)in_stack_fffffffffffffa00,(EExpr *)in_stack_fffffffffffff9f8);
    EExpr::~EExpr((EExpr *)0x3e52f7);
    LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffffa00);
    AlgebraicExpression<mp::LinTerms>::~AlgebraicExpression
              ((AlgebraicExpression<mp::LinTerms> *)0x3e5311);
  }
  bVar1 = AlgebraicExpression<mp::QuadAndLinTerms>::is_affine
                    ((AlgebraicExpression<mp::QuadAndLinTerms> *)0x3e5353);
  if ((!bVar1) &&
     (bVar1 = AlgebraicExpression<mp::QuadAndLinTerms>::is_constant
                        ((AlgebraicExpression<mp::QuadAndLinTerms> *)0x3e5368), !bVar1)) {
    in_stack_fffffffffffffa18 =
         (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          *)local_5a0;
    Convert2AffineExpr(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
    in_stack_fffffffffffffa20 = (AlgebraicExpression<mp::QuadAndLinTerms> *)&stack0xfffffffffffffae0
    ;
    LinTerms::LinTerms((LinTerms *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    EExpr::EExpr(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    EExpr::operator=((EExpr *)in_stack_fffffffffffffa00,(EExpr *)in_stack_fffffffffffff9f8);
    EExpr::~EExpr((EExpr *)0x3e53d9);
    LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffffa00);
    AlgebraicExpression<mp::LinTerms>::~AlgebraicExpression
              ((AlgebraicExpression<mp::LinTerms> *)0x3e53f0);
  }
  bVar1 = IfQuadratizePow2((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                            *)0x3e542c);
  if (((!bVar1) &&
      (bVar1 = AlgebraicExpression<mp::QuadAndLinTerms>::is_constant
                         ((AlgebraicExpression<mp::QuadAndLinTerms> *)0x3e5441), !bVar1)) &&
     (bVar1 = AlgebraicExpression<mp::QuadAndLinTerms>::is_constant
                        ((AlgebraicExpression<mp::QuadAndLinTerms> *)0x3e5456), !bVar1)) {
    QuadAndLinTerms::GetLinTerms((QuadAndLinTerms *)local_20);
    sVar3 = LinTerms::size((LinTerms *)0x3e5473);
    QuadAndLinTerms::GetLinTerms((QuadAndLinTerms *)local_18);
    sVar4 = LinTerms::size((LinTerms *)0x3e548d);
    if (sVar3 == sVar4) {
      QuadAndLinTerms::GetLinTerms((QuadAndLinTerms *)local_18);
      QuadAndLinTerms::GetLinTerms((QuadAndLinTerms *)local_20);
      sVar3 = LinTerms::size((LinTerms *)0x3e54cc);
      if (sVar3 == 1) {
        dVar5 = AlgebraicExpression<mp::QuadAndLinTerms>::constant_term
                          ((AlgebraicExpression<mp::QuadAndLinTerms> *)local_20);
        if ((dVar5 == 0.0) && (!NAN(dVar5))) {
          dVar5 = AlgebraicExpression<mp::QuadAndLinTerms>::constant_term
                            ((AlgebraicExpression<mp::QuadAndLinTerms> *)local_18);
          if ((dVar5 == 0.0) && (!NAN(dVar5))) {
            in_stack_fffffffffffffa0c =
                 LinTerms::var((LinTerms *)in_stack_fffffffffffffa00,
                               (size_t)in_stack_fffffffffffff9f8);
            iVar2 = LinTerms::var((LinTerms *)in_stack_fffffffffffffa00,
                                  (size_t)in_stack_fffffffffffff9f8);
            if (in_stack_fffffffffffffa0c == iVar2) {
              Convert2Pow2((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                            *)in_stack_fffffffffffffaa8.env_,in_stack_fffffffffffffaa0,
                           in_stack_fffffffffffffa98);
              return (EExpr *)this_00;
            }
          }
        }
      }
      QuadAndLinTerms::sort_terms((QuadAndLinTerms *)in_stack_fffffffffffffa00);
      QuadAndLinTerms::sort_terms((QuadAndLinTerms *)in_stack_fffffffffffffa00);
      bVar1 = AlgebraicExpression<mp::QuadAndLinTerms>::operator==
                        (in_stack_fffffffffffffa20,
                         (AlgebraicExpression<mp::QuadAndLinTerms> *)in_stack_fffffffffffffa18);
      if (bVar1) {
        Convert2Pow2(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
        return (EExpr *)this_00;
      }
    }
  }
  QuadAndLinTerms::GetLinTerms((QuadAndLinTerms *)local_20);
  sVar3 = LinTerms::size((LinTerms *)0x3e55bf);
  if (sVar3 != 0) {
    QuadAndLinTerms::GetLinTerms((QuadAndLinTerms *)local_18);
    sVar3 = LinTerms::size((LinTerms *)0x3e55de);
    if (sVar3 != 0) {
      iVar2 = IfMultOutQPTerms(in_stack_fffffffffffffa00);
      if (iVar2 != 0) {
        in_stack_fffffffffffffa00 =
             (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *)QuadAndLinTerms::GetLinTerms((QuadAndLinTerms *)local_18);
        QuadAndLinTerms::GetLinTerms((QuadAndLinTerms *)local_20);
        bVar1 = IfMultOutQPTerms(this_00,(LinTerms *)in_RDI,in_stack_fffffffffffffa30);
        if (bVar1) goto LAB_003e5649;
      }
      DontMultOut(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      return (EExpr *)this_00;
    }
  }
LAB_003e5649:
  MultiplyOut((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
              (EExpr *)in_stack_fffffffffffffa00,(EExpr *)in_stack_fffffffffffff9f8);
  return (EExpr *)this_00;
}

Assistant:

EExpr QuadratizeOrLinearize(EExpr& el, EExpr& er) {
    if (!el.is_affine() && !er.is_constant())
      el = Convert2AffineExpr(std::move(el));      // will convert to a new var now
    if (!er.is_affine() && !el.is_constant())
      er = Convert2AffineExpr(std::move(er));
    if (!IfQuadratizePow2() &&
        !er.is_constant() && !el.is_constant() &&
        er.GetLinTerms().size() == el.GetLinTerms().size()) {
      const auto& ellt = el.GetLinTerms();
      const auto& erlt = er.GetLinTerms();
      if (1 == erlt.size() &&    // same variable in el and er
          0.0 == er.constant_term() && 0.0 == el.constant_term() &&
          ellt.var(0) == erlt.var(0)) {
        return Convert2Pow2(ellt, erlt);
      }
      el.sort_terms();
      er.sort_terms();
      if  (el == er) {            // Convert expr*expr to expr^2
        return Convert2Pow2(std::move(el));
      }
    }  // Otherwise, we proceed to store proper multiplication,
    // unless the result is affine
    if (er.GetLinTerms().size() && el.GetLinTerms().size()  // both linear
        && (!IfMultOutQPTerms()
            || !IfMultOutQPTerms(el.GetLinTerms(), er.GetLinTerms()))) {
      // Create a separate QC with this product.
      // This is handy if we are walking the objective,
      // as MIPFlatCvt only linearizes QC.
      return DontMultOut(std::move(el), std::move(er));
    }
    return MultiplyOut(el, er);   // Quadratize
  }